

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitIO.cpp
# Opt level: O0

void __thiscall BitOutStream::crcCheck(BitOutStream *this,bool filled)

{
  byte bVar1;
  uchar uVar2;
  BitOutStream *this_00;
  byte in_SIL;
  size_t in_RDI;
  value_type_conflict2 *in_stack_ffffffffffffffd8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  undefined6 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff6;
  undefined1 uVar3;
  
  bVar1 = in_SIL & 1;
  if (*(int *)(in_RDI + 0x58) == *(int *)(in_RDI + 0x54)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11e9f6);
    this_00 = (BitOutStream *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x38));
    CRC::CRC_8_LTE();
    uVar2 = CRC::Calculate<unsigned_char,(unsigned_short)8>
                      ((void *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffff6,
                                                       in_stack_fffffffffffffff0)),in_RDI,
                       (Parameters<unsigned_char,_(unsigned_short)8> *)this_00);
    if (uVar2 == '\0') {
      if ((*(byte *)(in_RDI + 0x6c) & 1) == 0) {
        if ((bVar1 & 1) == 0) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11eacb);
          *(undefined1 *)(in_RDI + 100) = 0;
          *(undefined4 *)(in_RDI + 0x58) = 0;
          *(undefined4 *)(in_RDI + 0x68) = 0;
          fillBuffer(this_00);
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11ea92);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11eaa0);
          if (*(int *)(in_RDI + 0x18) == 1) {
            *(undefined4 *)(in_RDI + 0x58) = 0;
            *(undefined1 *)(in_RDI + 100) = 0;
          }
        }
      }
      else {
        *(undefined1 *)(in_RDI + 100) = 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11ea5a);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11ea68);
        *(undefined4 *)(in_RDI + 0x58) = 0;
        *(undefined4 *)(in_RDI + 0x68) = 0;
      }
    }
    else {
      *(undefined1 *)(in_RDI + 0x5e) = 1;
    }
  }
  else {
    uVar3 = *(undefined1 *)(in_RDI + 0x5d);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x58) + 1;
    *(undefined1 *)(in_RDI + 0x5d) = 0;
    *(undefined4 *)(in_RDI + 0x68) = 0;
    crcCheck((BitOutStream *)CONCAT17(bVar1,CONCAT16(uVar3,in_stack_fffffffffffffff0)),
             SUB81(in_RDI >> 0x38,0));
  }
  return;
}

Assistant:

void BitOutStream::crcCheck(bool filled) {
    if (numCrcBytes == maxBuffer) {
        if (CRC::Calculate(crcBuffer.data(), crcBuffer.size() * sizeof(char), CRC::CRC_8_LTE()) != 0) {
            failedSync = true;
        } else if(done){
            crcFlag = false;
            crcBuffer.clear();
            wBuffer.clear();
            numCrcBytes = 0;
            nBitsDone = 0;
        } else if (filled) {
            crcBuffer.clear();
            wBuffer.clear();
            if (sync == 1) {
                numCrcBytes = 0;
                crcFlag = false;
            }
        } else {
            crcBuffer.clear();
            crcFlag = false;
            numCrcBytes = 0;
            nBitsDone = 0;
            fillBuffer();
        }
    } else {
        crcBuffer.push_back(static_cast<unsigned char>(cByte));
        numCrcBytes++;
        cByte = static_cast<unsigned char>(0);
        nBitsDone = 0;
        crcCheck(true);
    }
}